

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O2

ElemBase *
Assimp::Blender::getCustomDataLayerData(CustomData *customdata,CustomDataType cdtype,string *name)

{
  ElemBase *pEVar1;
  shared_ptr<Assimp::Blender::CustomDataLayer> pLayer;
  long local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  getCustomDataLayer((Blender *)&local_18,customdata,cdtype,name);
  if (local_18 == 0) {
    pEVar1 = (ElemBase *)0x0;
  }
  else {
    pEVar1 = *(ElemBase **)(local_18 + 0x70);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  return pEVar1;
}

Assistant:

const ElemBase * getCustomDataLayerData(const CustomData &customdata, const CustomDataType cdtype, const std::string &name)
        {
            const std::shared_ptr<CustomDataLayer> pLayer = getCustomDataLayer(customdata, cdtype, name);
            if (pLayer && pLayer->data) {
                return pLayer->data.get();
            }
            return nullptr;
        }